

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.c
# Opt level: O2

int source_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  int converter_type;
  long *plVar1;
  FILE *__stream;
  SRC_STATE *state;
  code *pcVar2;
  char *pcVar3;
  mixed_channel_t i;
  ulong uVar4;
  int e;
  
  plVar1 = (long *)segment->data;
  if (field == 1) {
    if (*value == '\x01') {
      for (uVar4 = 0; uVar4 < *(byte *)(*plVar1 + 0x1c); uVar4 = uVar4 + 1) {
        mixed_buffer_clear((mixed_buffer *)plVar1[uVar4 + 1]);
      }
      pcVar2 = mix_noop;
    }
    else {
      pcVar2 = source_segment_mix;
    }
    segment->mix = pcVar2;
  }
  else {
    if (field != 3) {
      if (field == 4) {
        converter_type = *value;
        *(int *)((long)plVar1 + 0x7c) = converter_type;
        state = src_new(converter_type,(uint)*(byte *)(*plVar1 + 0x1c),&e);
        __stream = _stderr;
        if (state == (SRC_STATE *)0x0) {
          pcVar3 = src_strerror(e);
          fprintf(__stream,"libsamplerate: %s\n",pcVar3);
          mixed_err(1);
        }
        else {
          src_delete(state);
        }
        return (uint)(state != (SRC_STATE *)0x0);
      }
      mixed_err(7);
      return 0;
    }
    *(undefined4 *)(plVar1 + 0xf) = *value;
  }
  return 1;
}

Assistant:

int source_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct pack_segment_data *data = (struct pack_segment_data *)segment->data;
  
  switch(field){
  case MIXED_RESAMPLE_TYPE: {
    int e;
    data->quality = *(enum mixed_resample_type *)value;
    // Always allocate it now ahead of start to catch errors in the value
    // or configuration.
    SRC_STATE *new = src_new(data->quality, data->pack->channels, &e);
    if(!new){
      fprintf(stderr, "libsamplerate: %s\n", src_strerror(e));
      mixed_err(MIXED_OUT_OF_MEMORY);
      return 0;
    }
    src_delete(new);
  }
    return 1;
  case MIXED_VOLUME:
    data->target_volume = *((float *)value);
    return 1;
  case MIXED_BYPASS:
    if(*(bool *)value){
      for(mixed_channel_t i=0; i<data->pack->channels; ++i){
        mixed_buffer_clear(data->buffers[i]);
      }
      segment->mix = mix_noop;
    }else{
      segment->mix = source_segment_mix;
    }
    return 1;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}